

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exporter.cpp
# Opt level: O2

bool __thiscall FSSExporter::do_export(FSSExporter *this)

{
  ulong uVar1;
  PrivateShared *pPVar2;
  char cVar3;
  Type TVar4;
  Resource resource;
  Resource resource_00;
  Resource resource_01;
  QArrayDataPointer<char16_t> *this_00;
  long lVar5;
  anon_union_24_3_e3d07ef4_for_data local_100;
  QSettings meta_file;
  QVariant local_d0;
  string local_b0;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  
  QDir::QDir((QDir *)local_100.data,(QString *)&this->path);
  pPVar2 = *(PrivateShared **)&this->dir;
  *(PrivateShared **)&this->dir = local_100.shared;
  local_100.shared = pPVar2;
  QDir::~QDir((QDir *)local_100.data);
  cVar3 = QDir::exists();
  if (cVar3 != '\0') {
    operator+((QString *)&local_100,&this->path,"/meta.ini");
    QSettings::QSettings(&meta_file,(QString *)local_100.data,IniFormat,(QObject *)0x0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_100);
    QString::QString((QString *)&local_d0,"scale");
    QString::number((int)&local_b0,this->scale);
    QVariant::QVariant((QVariant *)&local_100,(QString *)&local_b0);
    QSettings::setValue((QString *)&meta_file,&local_d0);
    QVariant::~QVariant((QVariant *)&local_100);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_d0);
    QString::QString((QString *)&local_d0,"name");
    QVariant::QVariant((QVariant *)&local_100,(this->name)._M_dataplus._M_p);
    QSettings::setValue((QString *)&meta_file,&local_d0);
    QVariant::~QVariant((QVariant *)&local_100);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_d0);
    for (lVar5 = -0x21; lVar5 != 0; lVar5 = lVar5 + 1) {
      uVar1 = lVar5 + 0x22;
      resource_01 = (Resource)uVar1;
      TVar4 = Data::get_resource_type(resource_01);
      switch(TVar4) {
      case TypeSprite:
        exportResourceSprite(this,resource_01);
        break;
      case TypeAnimation:
        exportResourceAnimation(this,resource_01);
        break;
      case TypeSound:
        QString::QString((QString *)&local_78,"wav");
        this_00 = &local_78;
        exportResourceData(this,resource_01,(QString *)this_00);
        goto LAB_0011ef93;
      case TypeMusic:
        QString::QString((QString *)&local_90,"mid");
        this_00 = &local_90;
        exportResourceData(this,resource_01,(QString *)this_00);
LAB_0011ef93:
        QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
      }
      QString::QString((QString *)&local_60,"resources/");
      Data::get_resource_name_abi_cxx11_((string *)&local_100,(Data *)(uVar1 & 0xffffffff),resource)
      ;
      operator+((QString *)&local_48,(QString *)&local_60,(char *)local_100.shared);
      Data::get_resource_name_abi_cxx11_(&local_b0,(Data *)(uVar1 & 0xffffffff),resource_00);
      QVariant::QVariant(&local_d0,local_b0._M_dataplus._M_p);
      QSettings::setValue((QString *)&meta_file,(QVariant *)&local_48);
      QVariant::~QVariant(&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      std::__cxx11::string::~string((string *)local_100.data);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    }
    QSettings::~QSettings(&meta_file);
  }
  return (bool)cVar3;
}

Assistant:

bool
FSSExporter::do_export() {
  dir = QDir(path);
  if (!dir.exists()) {
    return false;
  }

  QSettings meta_file(path + "/meta.ini", QSettings::IniFormat);

  meta_file.setValue("scale", QString::number(scale));
  meta_file.setValue("name", name.c_str());

  for (size_t r = Data::AssetArtLandscape; r <= Data::AssetCursor; r++) {
    Data::Resource res = static_cast<Data::Resource>(r);
    switch (Data::get_resource_type(res)) {
      case Data::TypeSprite: {
        exportResourceSprite(res);
        break;
      }
      case Data::TypeAnimation: {
        exportResourceAnimation(res);
        break;
      }
      case Data::TypeSound: {
        exportResourceData(res, "wav");
        break;
      }
      case Data::TypeMusic: {
        exportResourceData(res, "mid");
        break;
      }
      default: {
        break;
      }
    }
    meta_file.setValue(QString("resources/")
                       + Data::get_resource_name(res).c_str(),
                       Data::get_resource_name(res).c_str());
  }

  return true;
}